

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::integrators::Integrator::Integrator
          (Integrator *this,shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  undefined8 *in_RDI;
  IntegratorInfoData *in_stack_ffffffffffffff98;
  shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *data;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_stack_ffffffffffffffa0;
  IntegratorInfo *this_00;
  IntegratorInfoData *this_01;
  IntegratorInfo local_30 [3];
  
  *in_RDI = &PTR__Integrator_003fa840;
  in_RDI[1] = 0;
  std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::shared_ptr
            (in_stack_ffffffffffffffa0,
             (shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)in_stack_ffffffffffffff98);
  std::
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ::vector((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
            *)0x2f508f);
  this_01 = (IntegratorInfoData *)(in_RDI + 7);
  operator_new(0x30);
  IntegratorInfoData::IntegratorInfoData(this_01);
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::
  shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,void>
            ((shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  data = (shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)(in_RDI + 9);
  this_00 = local_30;
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::shared_ptr
            (&this_00->m_data,data);
  IntegratorInfo::IntegratorInfo(this_00,data);
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)0x2f5108);
  return;
}

Assistant:

Integrator::Integrator(const std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> dynamicalSystem)
            : m_dTmax(0)
            , m_dynamicalSystem_ptr(dynamicalSystem)
            , m_infoData(new IntegratorInfoData)
            , m_info(m_infoData)
            {
            }